

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O2

int Aig_ManCiCleanup(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *Entry;
  int i;
  int iVar2;
  
  iVar1 = p->nObjs[2];
  iVar2 = 0;
  for (i = 0; p_00 = p->vCis, i < p_00->nSize; i = i + 1) {
    Entry = Vec_PtrEntry(p_00,i);
    if ((i < p->nObjs[2] - p->nRegs) && ((*(uint *)((long)Entry + 0x18) & 0xffffffc0) == 0)) {
      Vec_PtrWriteEntry(p->vObjs,*(int *)((long)Entry + 0x24),(void *)0x0);
    }
    else {
      Vec_PtrWriteEntry(p->vCis,iVar2,Entry);
      iVar2 = iVar2 + 1;
    }
  }
  Vec_PtrShrink(p_00,iVar2);
  iVar2 = p->vCis->nSize;
  p->nObjs[2] = iVar2;
  if (p->nRegs != 0) {
    p->nTruePis = iVar2 - p->nRegs;
  }
  return iVar1 - iVar2;
}

Assistant:

int Aig_ManCiCleanup( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, k = 0, nPisOld = Aig_ManCiNum(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vCis, pObj, i )
    {
        if ( i >= Aig_ManCiNum(p) - Aig_ManRegNum(p) )
            Vec_PtrWriteEntry( p->vCis, k++, pObj );
        else if ( Aig_ObjRefs(pObj) > 0 )
            Vec_PtrWriteEntry( p->vCis, k++, pObj );
        else
            Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
    }
    Vec_PtrShrink( p->vCis, k );
    p->nObjs[AIG_OBJ_CI] = Vec_PtrSize( p->vCis );
    if ( Aig_ManRegNum(p) )
        p->nTruePis = Aig_ManCiNum(p) - Aig_ManRegNum(p);
    return nPisOld - Aig_ManCiNum(p);
}